

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.h
# Opt level: O2

void __thiscall
DIS::ElectromagneticEmissionBeamData::setFundamentalParameterData
          (ElectromagneticEmissionBeamData *this,FundamentalParameterData *pX)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = pX->_beamSweepSync;
  (this->_fundamentalParameterData)._beamElevationSweep = pX->_beamElevationSweep;
  (this->_fundamentalParameterData)._beamSweepSync = fVar1;
  fVar4 = pX->_frequency;
  fVar5 = pX->_frequencyRange;
  fVar6 = pX->_effectiveRadiatedPower;
  fVar7 = pX->_pulseRepetitionFrequency;
  fVar1 = pX->_beamAzimuthCenter;
  fVar2 = pX->_beamAzimuthSweep;
  fVar3 = pX->_beamElevationCenter;
  (this->_fundamentalParameterData)._pulseWidth = pX->_pulseWidth;
  (this->_fundamentalParameterData)._beamAzimuthCenter = fVar1;
  (this->_fundamentalParameterData)._beamAzimuthSweep = fVar2;
  (this->_fundamentalParameterData)._beamElevationCenter = fVar3;
  (this->_fundamentalParameterData)._frequency = fVar4;
  (this->_fundamentalParameterData)._frequencyRange = fVar5;
  (this->_fundamentalParameterData)._effectiveRadiatedPower = fVar6;
  (this->_fundamentalParameterData)._pulseRepetitionFrequency = fVar7;
  return;
}

Assistant:

class OPENDIS6_EXPORT FundamentalParameterData
{
protected:
  /** center frequency of the emission in hertz. */
  float _frequency; 

  /** Bandwidth of the frequencies corresponding to the fequency field. */
  float _frequencyRange; 

  /** Effective radiated power for the emission in DdBm. For a      radar noise jammer, indicates the peak of the transmitted power. */
  float _effectiveRadiatedPower; 

  /** Average repetition frequency of the emission in hertz. */
  float _pulseRepetitionFrequency; 

  /** Average pulse width  of the emission in microseconds. */
  float _pulseWidth; 

  /** Specifies the beam azimuth an elevation centers and corresponding half-angles     to describe the scan volume */
  float _beamAzimuthCenter; 

  /** Specifies the beam azimuth sweep to determine scan volume */
  float _beamAzimuthSweep; 

  /** Specifies the beam elevation center to determine scan volume */
  float _beamElevationCenter; 

  /** Specifies the beam elevation sweep to determine scan volume */
  float _beamElevationSweep; 

  /** allows receiver to synchronize its regenerated scan pattern to     that of the emmitter. Specifies the percentage of time a scan is through its pattern from its origion. */
  float _beamSweepSync; 


 public:
    FundamentalParameterData();
    virtual ~FundamentalParameterData();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getFrequency() const; 
    void setFrequency(float pX); 

    float getFrequencyRange() const; 
    void setFrequencyRange(float pX); 

    float getEffectiveRadiatedPower() const; 
    void setEffectiveRadiatedPower(float pX); 

    float getPulseRepetitionFrequency() const; 
    void setPulseRepetitionFrequency(float pX); 

    float getPulseWidth() const; 
    void setPulseWidth(float pX); 

    float getBeamAzimuthCenter() const; 
    void setBeamAzimuthCenter(float pX); 

    float getBeamAzimuthSweep() const; 
    void setBeamAzimuthSweep(float pX); 

    float getBeamElevationCenter() const; 
    void setBeamElevationCenter(float pX); 

    float getBeamElevationSweep() const; 
    void setBeamElevationSweep(float pX); 

    float getBeamSweepSync() const; 
    void setBeamSweepSync(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const FundamentalParameterData& rhs) const;
}